

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O0

void intgemm::kernel_upcast16to32_test<(intgemm::CPUType)4>(void)

{
  longlong alVar1 [8];
  ulong uVar2;
  short *__first;
  short *__last;
  longlong (*palVar3) [8];
  size_t sVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_stack_000000b8 [64];
  AssertionHandler catchAssertionHandler;
  size_t i;
  dvector_t<(intgemm::CPUType)4,_int> result;
  AlignedVector<int> output;
  AlignedVector<short> input;
  int LENGTH;
  undefined1 auVar7 [24];
  undefined1 in_stack_fffffffffffffc40 [64];
  ExprLhs<const_int_&> *in_stack_fffffffffffffc80;
  SourceLineInfo local_1f0;
  StringRef local_1e0;
  ulong local_188;
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  AlignedVector<int> local_78;
  AlignedVector<short> local_68;
  undefined4 local_54;
  
  auVar7 = in_stack_fffffffffffffc40._8_24_;
  if (3 < kCPU) {
    local_54 = 0x20;
    AlignedVector<short>::AlignedVector
              (in_stack_fffffffffffffc40._24_8_,in_stack_fffffffffffffc40._16_8_,
               in_stack_fffffffffffffc40._8_8_);
    AlignedVector<int>::AlignedVector(auVar7._16_8_,auVar7._8_8_,auVar7._0_8_);
    __first = AlignedVector<short>::begin(&local_68);
    __last = AlignedVector<short>::end(&local_68);
    std::iota<short*,short>(__first,__last,-0x10);
    palVar3 = AlignedVector<short>::as<long_long__vector(8)>(&local_68);
    auVar5 = vmovdqa64_avx512f((undefined1  [64])*palVar3);
    local_180 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(local_180);
    auVar5 = vmovdqa64_avx512f(auVar5);
    kernels::upcast16to32((vector_t<CPUType::AVX512BW,_int>)in_stack_000000b8);
    auVar6 = vmovdqa64_avx512f(local_140);
    palVar3 = AlignedVector<int>::as<long_long__vector(8)>(&local_78);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar6);
    *palVar3 = alVar1;
    auVar6 = vmovdqa64_avx512f(local_100);
    palVar3 = AlignedVector<int>::as<long_long__vector(8)>(&local_78);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar6);
    palVar3[1] = alVar1;
    for (local_188 = 0; uVar2 = local_188, sVar4 = AlignedVector<int>::size(&local_78),
        uVar2 < sVar4; local_188 = local_188 + 1) {
      local_1e0 = operator____catch_sr(auVar5._8_8_,auVar5._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
                 ,0x40);
      Catch::StringRef::StringRef(auVar5._24_8_,auVar5._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar5._24_8_,auVar5._16_8_,auVar5._8_8_,auVar5._32_16_,auVar5._4_4_);
      AlignedVector<int>::operator[](&local_78,local_188);
      Catch::Decomposer::operator<=(auVar5._0_8_,(int *)0x2896a4);
      AlignedVector<short>::operator[](&local_68,local_188);
      Catch::ExprLhs<int_const&>::operator==(in_stack_fffffffffffffc80,auVar5._56_8_);
      Catch::AssertionHandler::handleExpr(auVar5._8_8_,auVar5._0_8_);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x289726);
      Catch::AssertionHandler::complete(auVar5._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar5._8_8_);
    }
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x289841);
    AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x28984e);
  }
  return;
}

Assistant:

void kernel_upcast16to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int16_t);

  AlignedVector<int16_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int16_t>(-LENGTH / 2));

  auto result = kernels::upcast16to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}